

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O1

void mi_segment_try_purge(mi_segment_t *segment,_Bool force)

{
  size_t sVar1;
  ulong uVar2;
  mi_msecs_t mVar3;
  size_t sVar4;
  ulong uVar5;
  size_t idx;
  mi_commit_mask_t mask;
  size_t local_80;
  mi_commit_mask_t local_78;
  
  if ((segment->allow_purge == true) && (segment->purge_expire != 0)) {
    if ((segment->purge_mask).mask[0] == 0) {
      uVar2 = 0;
      do {
        uVar5 = uVar2;
        if (uVar5 == 7) break;
        uVar2 = uVar5 + 1;
      } while ((segment->purge_mask).mask[uVar5 + 1] == 0);
      if (6 < uVar5) {
        return;
      }
    }
    mVar3 = _mi_clock_now();
    if ((force) || (segment->purge_expire <= mVar3)) {
      local_78.mask[0] = (segment->purge_mask).mask[0];
      local_78.mask[1] = (segment->purge_mask).mask[1];
      local_78.mask[2] = (segment->purge_mask).mask[2];
      local_78.mask[3] = (segment->purge_mask).mask[3];
      local_78.mask[4] = (segment->purge_mask).mask[4];
      local_78.mask[5] = (segment->purge_mask).mask[5];
      local_78.mask[6] = (segment->purge_mask).mask[6];
      local_78.mask[7] = (segment->purge_mask).mask[7];
      (segment->purge_mask).mask[7] = 0;
      (segment->purge_mask).mask[5] = 0;
      (segment->purge_mask).mask[6] = 0;
      (segment->purge_mask).mask[3] = 0;
      (segment->purge_mask).mask[4] = 0;
      (segment->purge_mask).mask[1] = 0;
      (segment->purge_mask).mask[2] = 0;
      segment->purge_expire = 0;
      (segment->purge_mask).mask[0] = 0;
      local_80 = 0;
      sVar4 = _mi_commit_mask_next_run(&local_78,&local_80);
      if (sVar4 != 0) {
        do {
          sVar1 = local_80;
          mi_segment_purge(segment,(uint8_t *)(local_80 * 0x10000 + (long)segment),sVar4 << 0x10);
          local_80 = sVar1 + sVar4;
          sVar4 = _mi_commit_mask_next_run(&local_78,&local_80);
        } while (sVar4 != 0);
      }
    }
  }
  return;
}

Assistant:

static void mi_segment_try_purge(mi_segment_t* segment, bool force) {
  if (!segment->allow_purge || segment->purge_expire == 0 || mi_commit_mask_is_empty(&segment->purge_mask)) return;
  mi_msecs_t now = _mi_clock_now();
  if (!force && now < segment->purge_expire) return;

  mi_commit_mask_t mask = segment->purge_mask;
  segment->purge_expire = 0;
  mi_commit_mask_create_empty(&segment->purge_mask);

  size_t idx;
  size_t count;
  mi_commit_mask_foreach(&mask, idx, count) {
    // if found, decommit that sequence
    if (count > 0) {
      uint8_t* p = (uint8_t*)segment + (idx*MI_COMMIT_SIZE);
      size_t size = count * MI_COMMIT_SIZE;
      mi_segment_purge(segment, p, size);
    }
  }
  mi_commit_mask_foreach_end()
  mi_assert_internal(mi_commit_mask_is_empty(&segment->purge_mask));
}